

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v11::basic_memory_buffer<int,_500UL,_fmt::v11::detail::allocator<int>_>::grow
               (buffer<int> *buf,size_t size)

{
  int *piVar1;
  size_t sVar2;
  int *piVar3;
  buffer<int> *p;
  size_t sVar4;
  int *new_data;
  int *old_data;
  size_t new_capacity;
  size_t old_capacity;
  size_t max_size;
  basic_memory_buffer<int,_500UL,_fmt::v11::detail::allocator<int>_> *self;
  size_t size_local;
  buffer<int> *buf_local;
  
  detail::abort_fuzzing_if(5000 < size);
  piVar1 = (int *)std::allocator_traits<fmt::v11::detail::allocator<int>_>::max_size
                            ((allocator<int> *)&buf[0x3f].capacity_);
  sVar2 = detail::buffer<int>::capacity(buf);
  piVar3 = (int *)(sVar2 + (sVar2 >> 1));
  old_data = (int *)size;
  if ((size <= piVar3) && (old_data = piVar3, piVar1 < piVar3)) {
    old_data = (int *)max_of<unsigned_long>(size,(unsigned_long)piVar1);
  }
  p = (buffer<int> *)detail::buffer<int>::data(buf);
  piVar1 = detail::allocator<int>::allocate((allocator<int> *)&buf[0x3f].capacity_,(size_t)old_data)
  ;
  detail::buffer<int>::size(buf);
  sVar4 = detail::buffer<int>::size(buf);
  memcpy(piVar1,p,sVar4 << 2);
  detail::buffer<int>::set(buf,piVar1,(size_t)old_data);
  if (p != buf + 1) {
    detail::allocator<int>::deallocate((allocator<int> *)&buf[0x3f].capacity_,(int *)p,sVar2);
  }
  return;
}

Assistant:

static FMT_CONSTEXPR20 void grow(detail::buffer<T>& buf, size_t size) {
    detail::abort_fuzzing_if(size > 5000);
    auto& self = static_cast<basic_memory_buffer&>(buf);
    const size_t max_size =
        std::allocator_traits<Allocator>::max_size(self.alloc_);
    size_t old_capacity = buf.capacity();
    size_t new_capacity = old_capacity + old_capacity / 2;
    if (size > new_capacity)
      new_capacity = size;
    else if (new_capacity > max_size)
      new_capacity = max_of(size, max_size);
    T* old_data = buf.data();
    T* new_data = self.alloc_.allocate(new_capacity);
    // Suppress a bogus -Wstringop-overflow in gcc 13.1 (#3481).
    detail::assume(buf.size() <= new_capacity);
    // The following code doesn't throw, so the raw pointer above doesn't leak.
    memcpy(new_data, old_data, buf.size() * sizeof(T));
    self.set(new_data, new_capacity);
    // deallocate must not throw according to the standard, but even if it does,
    // the buffer already uses the new storage and will deallocate it in
    // destructor.
    if (old_data != self.store_) self.alloc_.deallocate(old_data, old_capacity);
  }